

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

void main_cold_11(void)

{
  ap_log(AP_LOG_LEVEL_ERROR,"Can not allocate memory for \'ctx->log_path\'\n");
  return;
}

Assistant:

static int init_log_path (AP_CTX *ctx)
{
	int				rc								= AP_NO_ERROR;
	size_t			size;
	BOOL			allocated_in_this_function		= FALSE;

	if (ctx->log_path == NULL)
	{
		if (ctx->default_dir == NULL)
		{
			rc = get_default_directory (ctx);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}

			rc = create_directory (ctx->default_dir);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}
		}

		allocated_in_this_function = TRUE;

		size = strlen (ctx->default_dir) + sizeof ("/") + sizeof (AP_DEFAULT_LOG_FILENAME) + 1;

		ctx->log_path = (char *) calloc (1, size);
		if (ctx->log_path == NULL)
		{
			ap_error ("Can not allocate memory for 'ctx->log_path'\n");
			rc = AP_ERROR_NO_MEMORY;

			goto finish;
		}

		ap_str_strlcpy (ctx->log_path, ctx->default_dir, size);
		ap_str_strlcat (ctx->log_path, "/", size);
		ap_str_strlcat (ctx->log_path, AP_DEFAULT_LOG_FILENAME, size);
	}

finish:
	if (rc != AP_NO_ERROR)
	{
		if (allocated_in_this_function == TRUE)
		{
			if (ctx->log_path != NULL)
			{
				free (ctx->log_path);
			}
		}
	}

	return rc;
}